

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

string * __thiscall
t_php_generator::php_namespace_suffix_abi_cxx11_
          (string *__return_storage_ptr__,t_php_generator *this,t_program *p)

{
  bool bVar1;
  long lVar2;
  char *__rhs;
  bool bVar3;
  bool bVar4;
  allocator local_b1;
  string local_b0 [34];
  byte local_8e;
  allocator local_8d [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string ns;
  t_program *p_local;
  t_php_generator *this_local;
  
  ns.field_2._8_8_ = p;
  php_namespace_base_abi_cxx11_((string *)local_40,this,p);
  lVar2 = std::__cxx11::string::size();
  local_8e = 0;
  if (lVar2 == 0) {
    std::allocator<char>::allocator();
    local_8e = 1;
    std::__cxx11::string::string((string *)&local_80,"",local_8d);
  }
  else {
    std::__cxx11::string::string((string *)&local_80,(string *)&this->nsglobal_);
  }
  lVar2 = std::__cxx11::string::size();
  bVar3 = false;
  bVar1 = false;
  bVar4 = false;
  if (lVar2 != 0) {
    lVar2 = std::__cxx11::string::size();
    bVar3 = lVar2 == 0;
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"",&local_b1);
    }
    else {
      std::__cxx11::string::string(local_b0,(string *)&this->nsglobal_);
    }
    bVar1 = true;
    lVar2 = std::__cxx11::string::size();
    bVar4 = lVar2 != 0;
  }
  __rhs = "";
  if (bVar4) {
    __rhs = "\\";
  }
  std::operator+(&local_60,&local_80,__rhs);
  std::operator+(__return_storage_ptr__,&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    std::__cxx11::string::~string(local_b0);
  }
  if (bVar3) {
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  std::__cxx11::string::~string((string *)&local_80);
  if ((local_8e & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_8d);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string php_namespace_suffix(const t_program* p) {
    string ns = php_namespace_base(p);

    return NSGLOBAL
      + (ns.size() && NSGLOBAL.size() ? "\\" : "")
      + ns;
  }